

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

AnalyserVariablePtr __thiscall
libcellml::Generator::GeneratorImpl::analyserVariable(GeneratorImpl *this,VariablePtr *variable)

{
  element_type *peVar1;
  bool bVar2;
  VariablePtr *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  AnalyserVariablePtr AVar4;
  VariablePtr modelVoiVariable;
  vector<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
  modelVariables;
  AnalyserVariablePtr modelVoi;
  VariablePtr local_78;
  vector<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
  local_68;
  VariablePtr local_50;
  __shared_ptr<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  (this->mModel).super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->mModel).super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  AnalyserModel::voi((AnalyserModel *)&local_40);
  if (local_40._M_ptr == (element_type *)0x0) {
    local_78.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_78.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    AnalyserVariable::variable((AnalyserVariable *)&local_78);
    if (local_78.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      bVar2 = AnalyserModel::areEquivalentVariables
                        ((AnalyserModel *)
                         (variable->
                         super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                         ,in_RDX,&local_78);
      if (bVar2) {
        std::__shared_ptr<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2> *)this,
                   &local_40);
        goto LAB_001c94a8;
      }
    }
  }
  AnalyserModel::states
            (&local_68,
             (AnalyserModel *)
             (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  for (p_Var3 = &(local_68.
                  super__Vector_base<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2>;
      p_Var3 != &(local_68.
                  super__Vector_base<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                 super___shared_ptr<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2>;
      p_Var3 = p_Var3 + 1) {
    peVar1 = (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    AnalyserVariable::variable((AnalyserVariable *)&local_50);
    bVar2 = AnalyserModel::areEquivalentVariables((AnalyserModel *)peVar1,in_RDX,&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_50.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (bVar2) {
      std::__shared_ptr<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2> *)this,
                 p_Var3);
      break;
    }
  }
  std::
  vector<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
  ::~vector(&local_68);
  if ((this->mModel).super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
    AnalyserModel::variables
              (&local_68,
               (AnalyserModel *)
               (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    p_Var3 = &(local_68.
               super__Vector_base<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2>;
    do {
      peVar1 = (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      AnalyserVariable::variable((AnalyserVariable *)&local_50);
      bVar2 = AnalyserModel::areEquivalentVariables((AnalyserModel *)peVar1,in_RDX,&local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_50.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (bVar2) {
        std::__shared_ptr<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2> *)this,
                   p_Var3);
      }
      else {
        p_Var3 = p_Var3 + 1;
      }
    } while ((this->mModel).super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr == (element_type *)0x0);
    std::
    vector<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
    ::~vector(&local_68);
  }
LAB_001c94a8:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  AVar4.super___shared_ptr<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  AVar4.super___shared_ptr<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (AnalyserVariablePtr)
         AVar4.super___shared_ptr<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

AnalyserVariablePtr Generator::GeneratorImpl::analyserVariable(const VariablePtr &variable) const
{
    // Find and return the analyser variable associated with the given variable.

    AnalyserVariablePtr res;
    auto modelVoi = mModel->voi();
    VariablePtr modelVoiVariable = (modelVoi != nullptr) ? modelVoi->variable() : nullptr;

    if ((modelVoiVariable != nullptr)
        && mModel->areEquivalentVariables(variable, modelVoiVariable)) {
        res = modelVoi;
    } else {
        for (const auto &modelState : mModel->states()) {
            if (mModel->areEquivalentVariables(variable, modelState->variable())) {
                res = modelState;

                break;
            }
        }

        if (res == nullptr) {
            // Normally, we would have:
            //
            //     for (const auto &modelVariable : mModel->variables()) {
            //         if (mModel->areEquivalentVariables(variable, modelVariable->variable())) {
            //             res = modelVariable;
            //
            //             break;
            //         }
            //     }
            //
            // but we always have variables, so llvm-cov will complain that the
            // false branch of our for loop is never reached. The below code is
            // a bit more verbose but at least it makes llvm-cov happy.

            auto modelVariables = mModel->variables();
            auto modelVariable = modelVariables.begin();

            do {
                if (mModel->areEquivalentVariables(variable, (*modelVariable)->variable())) {
                    res = *modelVariable;
                } else {
                    ++modelVariable;
                }
            } while (res == nullptr);
        }
    }

    return res;
}